

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

ostream * mat_lib::operator<<(ostream *os,vector<double> *vector)

{
  ostream *poVar1;
  code *pcVar2;
  int i;
  ulong uVar3;
  
  poVar1 = std::operator<<(os,"mat_lib::vector[");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"]{");
  poVar1 = os;
  if ((vector->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (vector->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (vector->format__ == fixed) {
      pcVar2 = std::fixed;
    }
    else {
      pcVar2 = std::scientific;
    }
    uVar3 = 0;
    while( true ) {
      if (vector->max_size__ - 1 <= uVar3) break;
      (*pcVar2)(os + *(long *)(*(long *)os + -0x18));
      *(long *)(os + *(long *)(*(long *)os + -0x18) + 8) = (long)vector->fractional_digits__;
      poVar1 = std::ostream::_M_insert<double>
                         ((vector->container__).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar3]);
      std::operator<<(poVar1,", ");
      uVar3 = uVar3 + 1;
    }
    poVar1 = std::ostream::_M_insert<double>
                       ((vector->container__).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[vector->max_size__ - 1]);
  }
  std::operator<<(poVar1,"}");
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const vector &vector) {
          os << "mat_lib::vector[" << vector.size() << "]{";

          if(vector.is_empty()){
             os << "}";
             return os;
          }

          auto formatter = vector.getFormat() == mat_lib::fixed ? std::fixed : std::scientific;
          for(int i = 0 ; i < vector.size()-1; i++)
          {
              os << formatter << setprecision(vector.getFractionalDigits()) << vector[i] << ", ";
          }
          os<< vector[vector.size()-1] << "}";
          return os;
      }